

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup_response.cc
# Opt level: O0

void __thiscall LookupResponse::LookupResponse(LookupResponse *this)

{
  shared_ptr<BlockInfo> *this_00;
  undefined8 *in_RDI;
  BlockInfo *__p;
  NamenodeResponse *in_stack_ffffffffffffffd0;
  
  NamenodeResponse::NamenodeResponse(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR_Update_0018f6e8;
  FileInfo::FileInfo((FileInfo *)(in_RDI + 2));
  __p = (BlockInfo *)(in_RDI + 9);
  this_00 = (shared_ptr<BlockInfo> *)operator_new(0x40);
  BlockInfo::BlockInfo((BlockInfo *)0x164b23);
  std::shared_ptr<BlockInfo>::shared_ptr<BlockInfo,void>(this_00,__p);
  return;
}

Assistant:

LookupResponse::LookupResponse()
    : NamenodeResponse(), block_info_(new BlockInfo()) {}